

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall RoomBase::handle(RoomBase *this,Event *event)

{
  pointer *ppPVar1;
  uint64_t uVar2;
  iterator __position;
  pointer pQVar3;
  pointer __s1;
  size_t __n;
  undefined8 uVar4;
  int iVar5;
  PlayerInfo *player_3;
  __normal_iterator<PlayerInfo_*,_std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>_> _Var6;
  long lVar7;
  pointer pPVar8;
  uint uVar9;
  PlayerInfo *player;
  PlayerInfo *pPVar10;
  pointer pPVar11;
  int8_t *piVar12;
  ulong uVar13;
  pointer pPVar14;
  ulong uVar15;
  iterator __begin4;
  iterator __end4;
  pointer __args;
  float fVar16;
  TTimestamp TVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  _Any_data local_90;
  code *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  uVar4 = local_90._8_8_;
  switch(event->type) {
  case StartNewRound:
    if (event->roomId == this->id) {
      this->roundId = this->roundId + 1;
      std::vector<Query,_std::allocator<Query>_>::_M_erase_at_end
                (&this->pool,
                 (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<Query,_std::allocator<Query>_>::_M_erase_at_end
                (&this->poolOld,
                 (this->poolOld).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((ulong)(((long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3) <
          (ulong)(long)this->poolSize) {
        do {
          (**this->_vptr_RoomBase)(&local_90,this);
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                    (&this->pool,(Query *)&local_90);
          if (local_58[0] != &local_48) {
            operator_delete(local_58[0],local_48._M_allocated_capacity + 1);
          }
          if (local_78 != &local_68) {
            operator_delete(local_78,local_68._0_8_ + 1);
          }
        } while ((ulong)(((long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pool).super__Vector_base<Query,_std::allocator<Query>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3)
                 < (ulong)(long)this->poolSize);
      }
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<PlayerInfo*,std::vector<PlayerInfo,std::allocator<PlayerInfo>>>,__gnu_cxx::__ops::_Iter_pred<RoomBase::handle(Event&&)::_lambda(auto:1_const&)_1_>>
                        ((this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      pPVar10 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (_Var6._M_current !=
          (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = _Var6._M_current;
      }
      for (; pPVar10 != _Var6._M_current; pPVar10 = pPVar10 + 1) {
        pPVar10->score = 0.0;
        pPVar10->active = '\x01';
      }
      if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
        handle();
      }
      lVar7 = std::chrono::_V2::steady_clock::now();
      lVar7 = lVar7 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart;
      auVar18._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar18._0_8_ = lVar7;
      auVar18._12_4_ = 0x45300000;
      this->tRoundStart_s =
           ((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 0.001;
      if (this->mode == BattleRoyale) {
        this->tRoundLength_s = this->tBRRoundLength_s;
      }
      local_90._8_8_ = 0;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
                    ::_M_invoke;
      local_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:205:37)>
                 ::_M_manager;
      local_90._M_unused._M_object = this;
      Notifier::notify(&this->notifier,(function<void_()> *)&local_90);
      if (local_80 != (code *)0x0) {
        (*local_80)(&local_90,&local_90,3);
      }
    }
    break;
  case CheckStart:
    if (event->roomId == this->id) {
      if (this->mode == BattleRoyale) {
        pPVar8 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pPVar14 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pPVar8 != pPVar14) {
          uVar9 = 0;
          do {
            uVar9 = (uVar9 + 1) - (uint)(pPVar8->active == '\0');
            pPVar8 = pPVar8 + 1;
          } while (pPVar8 != pPVar14);
          if (1 < uVar9) {
            TVar17 = anon_unknown.dwarf_10dbb::timestamp_s();
            auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms);
            auVar22._8_4_ = (int)(this->tTimeBetweenRounds_ms >> 0x20);
            auVar22._12_4_ = 0x45300000;
            this->tNextRoundStart_s =
                 ((auVar22._8_8_ - 1.9342813113834067e+25) + (auVar22._0_8_ - 4503599627370496.0)) *
                 0.001 + TVar17;
            local_90._8_8_ = 0;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                          ::_M_invoke;
            local_80 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:248:53)>
                       ::_M_manager;
            local_90._M_unused._M_object = this;
            Notifier::notify(&this->notifier,(function<void_()> *)&local_90);
            if (local_80 == (code *)0x0) {
              return;
            }
            (*local_80)(&local_90,&local_90,3);
            return;
          }
        }
        TVar17 = anon_unknown.dwarf_10dbb::timestamp_s();
        auVar23._0_8_ = (double)CONCAT44(0x43300000,(int)this->tTimeBetweenRounds_ms);
        auVar23._8_4_ = (int)(this->tTimeBetweenRounds_ms >> 0x20);
        auVar23._12_4_ = 0x45300000;
        this->tNextRoundStart_s =
             ((auVar23._8_8_ - 1.9342813113834067e+25) + (auVar23._0_8_ - 4503599627370496.0)) *
             0.001 + TVar17;
        local_90._8_8_ = 0;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                      ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:260:53)>
                   ::_M_manager;
        local_90._M_unused._M_object = this;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_90);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,3);
        }
      }
      else if (this->mode == Standard) {
        if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
          handle();
        }
        lVar7 = std::chrono::_V2::steady_clock::now();
        lVar7 = lVar7 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart;
        auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar20._0_8_ = lVar7;
        auVar20._12_4_ = 0x45300000;
        uVar2 = this->tTimeBetweenRounds_ms;
        auVar24._8_4_ = (int)(uVar2 >> 0x20);
        auVar24._0_8_ = uVar2;
        auVar24._12_4_ = 0x45300000;
        this->tNextRoundStart_s =
             ((auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 0.001 +
             ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 0.001;
        local_90._8_8_ = 0;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                      ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:225:49)>
                   ::_M_manager;
        local_90._M_unused._M_object = this;
        Notifier::notify(&this->notifier,(function<void_()> *)&local_90);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,3);
        }
      }
    }
    break;
  case EndRound:
    local_90._4_4_ = event->roomId;
    if (local_90._4_4_ == this->id) {
      if (this->mode == BattleRoyale) {
        uVar9 = 0;
        printf("Room %d: ending BR round %d\n",(ulong)(uint)local_90._4_4_,
               (ulong)(uint)this->roundId);
        pPVar8 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pPVar14 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        pPVar11 = pPVar8;
        if (pPVar8 != pPVar14) {
          do {
            uVar9 = uVar9 + (pPVar11->active == '\x01');
            pPVar11 = pPVar11 + 1;
          } while (pPVar11 != pPVar14);
          if (2 < uVar9) {
            uVar9 = (int)((long)pPVar14 - (long)pPVar8 >> 2) * -0x55555555;
            if ((int)uVar9 < 1) {
              lVar7 = -1;
            }
            else {
              piVar12 = &pPVar8->active;
              fVar16 = 1e+06;
              uVar15 = 0xffffffff;
              uVar13 = 0;
              do {
                if ((*(float *)(piVar12 + -4) < fVar16) && (*piVar12 == '\x01')) {
                  uVar15 = uVar13 & 0xffffffff;
                  fVar16 = *(float *)(piVar12 + -4);
                }
                uVar13 = uVar13 + 1;
                piVar12 = piVar12 + 0xc;
              } while ((uVar9 & 0x7fffffff) != uVar13);
              lVar7 = (long)(int)uVar15;
            }
            pPVar8[lVar7].active = '\x02';
            this->tRoundLength_s = this->tBRRoundLength_s + this->tRoundLength_s;
            local_90._8_8_ = 0;
            local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                          ::_M_invoke;
            local_80 = std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]typing-battles/src/common.h:324:53)>
                       ::_M_manager;
            local_90._M_unused._M_object = this;
            Notifier::notify(&this->notifier,(function<void_()> *)&local_90);
            if (local_80 == (code *)0x0) {
              return;
            }
            (*local_80)(&local_90,&local_90,3);
            return;
          }
        }
        printf("Room %d: ending round\n",(ulong)(uint)this->id);
        local_80 = (code *)&local_70;
        local_90._8_4_ = 0xffffffff;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_70 = 0;
        local_90._4_4_ = this->id;
        local_90._0_4_ = 2;
        Events::push((this->notifier).events,(Event *)&local_90);
      }
      else {
        if (this->mode != Standard) {
          return;
        }
        local_80 = (code *)&local_70;
        local_90._8_4_ = 0xffffffff;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_70 = 0;
        local_90._0_4_ = 2;
        Events::push((this->notifier).events,(Event *)&local_90);
      }
      if (local_80 != (code *)&local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
    }
    break;
  case PlayerJoinRoom:
    pPVar10 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (event->roomId != this->id) {
      for (; pPVar10 != __position._M_current; pPVar10 = pPVar10 + 1) {
        if (pPVar10->clientId == event->clientId) {
          pPVar10->active = '\0';
          printf("Client (%d) left room \'%s\' (%d)\n",(ulong)(uint)pPVar10->clientId,
                 (this->name)._M_dataplus._M_p,(ulong)(uint)this->id);
        }
      }
      return;
    }
    if (pPVar10 != __position._M_current) {
      do {
        if (pPVar10->clientId == event->clientId) {
          pPVar10->active = '\x01';
          return;
        }
        pPVar10 = pPVar10 + 1;
      } while (pPVar10 != __position._M_current);
    }
    local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
    if (this->mode == Standard) {
      local_90._M_pod_data[8] = 1;
LAB_0010a045:
      local_90._9_7_ = SUB87(uVar4,1);
    }
    else if (this->mode == BattleRoyale) {
      local_90._M_pod_data[8] = 2;
      goto LAB_0010a045;
    }
    local_90._4_4_ = 0;
    local_90._0_4_ = event->clientId;
    if (__position._M_current ==
        (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<PlayerInfo,_std::allocator<PlayerInfo>_>::_M_realloc_insert<PlayerInfo>
                (&this->players,__position,(PlayerInfo *)&local_90);
    }
    else {
      *(undefined4 *)&(__position._M_current)->active = local_90._8_4_;
      *(void **)__position._M_current = local_90._M_unused._M_object;
      ppPVar1 = &(this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    printf("Client (%d) joined room \'%s\' (%d)\n",(ulong)(uint)event->clientId,
           (this->name)._M_dataplus._M_p,(ulong)(uint)this->id);
    break;
  case PlayerInput:
    if (event->roomId == this->id) {
      if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
        handle();
      }
      lVar7 = std::chrono::_V2::steady_clock::now();
      lVar7 = lVar7 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart;
      auVar19._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar19._0_8_ = lVar7;
      auVar19._12_4_ = 0x45300000;
      if (((auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 0.001 <=
          this->tRoundStart_s + this->tRoundLength_s) {
        pPVar8 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar9 = (int)((long)(this->players).
                            super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pPVar8 >> 2) * -0x55555555;
        if (0 < (int)uVar9) {
          uVar13 = 0;
          pPVar14 = pPVar8;
          do {
            if (pPVar14->clientId == event->clientId) {
              if (pPVar8[uVar13 & 0xffffffff].active != '\x01') {
                return;
              }
              printf("Room %d: client %d submitted \'%s\'\n",(ulong)(uint)this->id,
                     (ulong)(uint)event->clientId,(event->inputStr)._M_dataplus._M_p);
              local_38 = (this->players).super__Vector_base<PlayerInfo,_std::allocator<PlayerInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + (uVar13 & 0xffffffff);
              __args = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pQVar3 = (this->pool).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (__args != pQVar3) {
                __s1 = (event->inputStr)._M_dataplus._M_p;
                __n = (event->inputStr)._M_string_length;
                do {
                  if ((__n == (__args->answer)._M_string_length) &&
                     ((__n == 0 ||
                      (iVar5 = bcmp(__s1,(__args->answer)._M_dataplus._M_p,__n), iVar5 == 0)))) {
                    local_38->score = (float)__n * 0.2 + 3.0 + local_38->score;
                    __args->clientId = event->clientId;
                    if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
                      handle();
                    }
                    lVar7 = std::chrono::_V2::steady_clock::now();
                    lVar7 = lVar7 / 1000000 - anon_unknown.dwarf_10dbb::timestamp_s::tStart;
                    auVar21._8_4_ = (int)((ulong)lVar7 >> 0x20);
                    auVar21._0_8_ = lVar7;
                    auVar21._12_4_ = 0x45300000;
                    __args->tGuessed_s =
                         ((auVar21._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 0.001;
                    std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>
                              (&this->poolOld,__args);
                    (**this->_vptr_RoomBase)(&local_90,this);
                    __args->tGuessed_s = (TTimestamp)local_80;
                    *(void **)__args = local_90._M_unused._M_object;
                    *(undefined8 *)&__args->clientId = local_90._8_8_;
                    std::__cxx11::string::operator=((string *)&__args->text,(string *)&local_78);
                    std::__cxx11::string::operator=((string *)&__args->answer,(string *)local_58);
                    if (local_58[0] != &local_48) {
                      operator_delete(local_58[0],local_48._M_allocated_capacity + 1);
                    }
                    if (local_78 != &local_68) {
                      operator_delete(local_78,local_68._0_8_ + 1);
                    }
                    puts("correct!");
                    return;
                  }
                  __args = __args + 1;
                } while (__args != pQVar3);
              }
              puts("wrong!");
              fVar16 = local_38->score + -1.0;
              local_38->score = fVar16;
              if (0.0 <= fVar16) {
                return;
              }
              local_38->score = 0.0;
              return;
            }
            uVar13 = uVar13 + 1;
            pPVar14 = pPVar14 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar13);
        }
      }
    }
    break;
  default:
    printf("Unhandled event, type = %d\n");
    return;
  }
  return;
}

Assistant:

virtual void handle(Event && event) {
        switch (event.type) {
            case Event::StartNewRound:
                {
                    if (event.roomId != id) return;

                    ++roundId;
                    //printf("Room %d: starting new round %d\n", id, roundId);

                    pool.clear();
                    poolOld.clear();
                    while (pool.size() < poolSize) {
                        pool.emplace_back(generate());
                    }

                    players.erase(std::remove_if(players.begin(), players.end(),
                                                 [](const auto & p) { return p.active == 0; }),
                                  players.end());

                    for (auto & player : players) {
                        player.score = 0.0f;
                        player.active = 1;
                    }

                    tRoundStart_s = timestamp_s();

                    switch (mode) {
                        case Standard:
                            {
                            }
                            break;
                        case BattleRoyale:
                            {
                                tRoundLength_s = tBRRoundLength_s;
                            }
                            break;
                    };

                    notifier.notify([&]() {
                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tRoundLength_s)));

                        Event event;
                        event.roomId = id;
                        event.type = Event::EndRound;

                        notifier.events->push(std::move(event));
                    });
                }
                break;
            case Event::CheckStart:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                notifier.notify([&]() {
                                    std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::StartNewRound;

                                    notifier.events->push(std::move(event));
                                });
                            }
                            break;
                        case BattleRoyale:
                            {
                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active != 0) {
                                        ++nActive;
                                    }
                                }

                                if (nActive > 1) {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenRounds_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::StartNewRound;

                                        notifier.events->push(std::move(event));
                                    });
                                } else {
                                    tNextRoundStart_s = timestamp_s() + 0.001*tTimeBetweenRounds_ms;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds(tTimeBetweenChecks_ms));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::CheckStart;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::EndRound:
                {
                    if (event.roomId != id) return;

                    switch (mode) {
                        case Standard:
                            {
                                //printf("Room %d: ending round %d\n", id, roundId);

                                Event event;
                                event.roomId = id;
                                event.type = Event::CheckStart;

                                notifier.events->push(std::move(event));
                            }
                            break;
                        case BattleRoyale:
                            {
                                printf("Room %d: ending BR round %d\n", id, roundId);

                                int nActive = 0;
                                for (auto & player : players) {
                                    if (player.active == 1) {
                                        ++nActive;
                                    }
                                }

                                if (nActive <= 2) {
                                    printf("Room %d: ending round\n", id);

                                    Event event;
                                    event.roomId = id;
                                    event.type = Event::CheckStart;

                                    notifier.events->push(std::move(event));
                                } else {
                                    int playerId = -1;
                                    float minScore = 1e6;
                                    for (int i = 0; i < (int) players.size(); ++i) {
                                        if (players[i].score < minScore && players[i].active == 1) {
                                            minScore = players[i].score;
                                            playerId = i;
                                        }
                                    }

                                    players[playerId].active = 2;

                                    tRoundLength_s += tBRRoundLength_s;

                                    notifier.notify([&]() {
                                        std::this_thread::sleep_for(std::chrono::milliseconds((uint64_t)(1000.0*tBRRoundLength_s)));

                                        Event event;
                                        event.roomId = id;
                                        event.type = Event::EndRound;

                                        notifier.events->push(std::move(event));
                                    });
                                }
                            }
                            break;
                    };
                }
                break;
            case Event::PlayerJoinRoom:
                {
                    if (event.roomId == id) {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 1;
                                return;
                            }
                        }

                        PlayerInfo player;

                        switch (mode) {
                            case Standard:
                                {
                                    player.active = 1;
                                }
                                break;
                            case BattleRoyale:
                                {
                                    player.active = 2;
                                }
                                break;
                        };
                        player.clientId = event.clientId;

                        players.emplace_back(std::move(player));

                        printf("Client (%d) joined room '%s' (%d)\n", event.clientId, name.c_str(), id);
                    } else {
                        for (auto & player : players) {
                            if (player.clientId == event.clientId) {
                                player.active = 0;

                                printf("Client (%d) left room '%s' (%d)\n", event.clientId, name.c_str(), id);
                            }
                        }
                    }
                }
                break;
            case Event::PlayerInput:
                {
                    if (event.roomId != id) return;
                    if (::timestamp_s() > tRoundStart_s + tRoundLength_s) return;

                    int playerId = -1;
                    for (int i = 0; i < (int) players.size(); ++i) {
                        if (players[i].clientId == event.clientId) {
                            playerId = i;
                            break;
                        }
                    }

                    if (playerId == -1) return;
                    if (players[playerId].active != 1) return;

                    printf("Room %d: client %d submitted '%s'\n", id, event.clientId, event.inputStr.data());

                    auto & player = players[playerId];

                    bool correct = false;
                    for (auto & query : pool) {
                        if (event.inputStr == query.answer) {
                            player.score += 3.0f + 0.2f*query.answer.size();
                            correct = true;
                            query.clientId = event.clientId;
                            query.tGuessed_s = ::timestamp_s();
                            poolOld.emplace_back(std::move(query));
                            query = generate();
                            printf("correct!\n");

                            break;
                        }
                    }

                    if (correct == false) {
                        printf("wrong!\n");
                        player.score -= 1.0f;
                        if (player.score < 0.0) player.score = 0.0f;
                    }
                }
                break;
            default:
                {
                    printf("Unhandled event, type = %d\n", event.type);
                }
                break;
        };
    }